

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O0

void __thiscall
wasm::DuplicateFunctionElimination::run(DuplicateFunctionElimination *this,Module *module)

{
  uint uVar1;
  value_type pFVar2;
  bool bVar3;
  PassOptions *pPVar4;
  size_type sVar5;
  PassRunner *pPVar6;
  reference ppFVar7;
  size_type sVar8;
  mapped_type *this_00;
  size_type sVar9;
  Map *in_RCX;
  pair<std::_Rb_tree_const_iterator<wasm::Name>,_bool> pVar10;
  anon_class_16_2_f86d9413 visitor;
  int local_2ec;
  anon_class_8_1_49e19e86 local_2e8;
  function<bool_(wasm::Function_*)> local_2e0;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  Function *local_2b0;
  Function *second;
  value_type pFStack_2a0;
  Index j;
  Function *first;
  Index i;
  Index size;
  type *group;
  type *_;
  _Self local_278;
  iterator __end3;
  iterator __begin3;
  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  *__range3;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> duplicates;
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  undefined1 local_1f0 [8];
  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  FunctionHasher local_1b0;
  undefined1 local_58 [8];
  Map hashes;
  Index limit;
  PassOptions *options;
  Module *module_local;
  DuplicateFunctionElimination *this_local;
  
  pPVar4 = Pass::getPassOptions(&this->super_Pass);
  if ((pPVar4->optimizeLevel < 3) && (pPVar4->shrinkLevel < 1)) {
    if (pPVar4->optimizeLevel < 2) {
      hashes.
      super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    }
    else {
      hashes.
      super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 10;
    }
  }
  else {
    sVar5 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::size(&module->functions);
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)sVar5;
  }
  do {
    if (hashes.
        super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
      return;
    }
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         hashes.
         super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
         ._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + -1;
    FunctionHasher::createMap((Map *)local_58,module);
    FunctionHasher::FunctionHasher(&local_1b0,(Map *)local_58);
    pPVar6 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
    ::run(&local_1b0.
           super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
          ,pPVar6,module);
    FunctionHasher::~FunctionHasher(&local_1b0);
    std::
    map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
    ::map((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
           *)local_1f0);
    visitor.hashes = in_RCX;
    visitor.hashGroups =
         (map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
          *)local_58;
    wasm::ModuleUtils::
    iterDefinedFunctions<wasm::DuplicateFunctionElimination::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
              ((ModuleUtils *)module,(Module *)local_1f0,visitor);
    std::
    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           *)&duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    __end3 = std::
             map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
             ::begin((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                      *)local_1f0);
    local_278._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
         ::end((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                *)local_1f0);
    while (bVar3 = std::operator!=(&__end3,&local_278), bVar3) {
      _ = &std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
           ::operator*(&__end3)->first;
      group = (type *)std::
                      get<0ul,unsigned_int_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                                ((pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                  *)_);
      _i = std::
           get<1ul,unsigned_int_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                     ((pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                       *)_);
      sVar5 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size(_i);
      first._4_4_ = (uint)sVar5;
      if (first._4_4_ != 1) {
        for (first._0_4_ = 0; in_RCX = (Map *)(ulong)(first._4_4_ - 1),
            (uint)first < first._4_4_ - 1; first._0_4_ = (uint)first + 1) {
          ppFVar7 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                              (_i,(ulong)(uint)first);
          pFStack_2a0 = *ppFVar7;
          sVar8 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             &__range3,(key_type *)pFStack_2a0);
          uVar1 = (uint)first;
          if (sVar8 == 0) {
            while (second._4_4_ = uVar1 + 1, second._4_4_ < first._4_4_) {
              ppFVar7 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[]
                                  (_i,(ulong)second._4_4_);
              local_2b0 = *ppFVar7;
              sVar8 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                      count((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                            &__range3,(key_type *)local_2b0);
              uVar1 = second._4_4_;
              if ((sVar8 == 0) &&
                 (bVar3 = FunctionUtils::equal(pFStack_2a0,local_2b0), pFVar2 = pFStack_2a0,
                 uVar1 = second._4_4_, bVar3)) {
                this_00 = std::
                          map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                          ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                        *)&duplicates._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count,(key_type *)local_2b0);
                wasm::Name::operator=(this_00,(Name *)pFVar2);
                pVar10 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                         insert((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                 *)&__range3,(value_type *)local_2b0);
                local_2c0 = (_Base_ptr)pVar10.first._M_node;
                local_2b8 = pVar10.second;
                uVar1 = second._4_4_;
              }
            }
          }
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
      ::operator++(&__end3);
    }
    sVar9 = std::
            map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::size((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)&duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar9 == 0) {
      local_2ec = 3;
    }
    else {
      local_2e8.duplicates =
           (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3;
      std::function<bool(wasm::Function*)>::
      function<wasm::DuplicateFunctionElimination::run(wasm::Module*)::_lambda(wasm::Function*)_2_,void>
                ((function<bool(wasm::Function*)> *)&local_2e0,&local_2e8);
      Module::removeFunctions(module,&local_2e0);
      std::function<bool_(wasm::Function_*)>::~function(&local_2e0);
      pPVar6 = Pass::getPassRunner(&this->super_Pass);
      OptUtils::replaceFunctions
                (pPVar6,module,
                 (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  *)&duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_2ec = 0;
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
              ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&__range3);
    std::
    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::~map((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            *)&duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
    ::~map((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
            *)local_1f0);
    FunctionHasher::Map::~Map((Map *)local_58);
  } while (local_2ec == 0);
  return;
}

Assistant:

void run(Module* module) override {
    // Multiple iterations may be necessary: A and B may be identical only after
    // we see the functions C1 and C2 that they call are in fact identical.
    // Rarely, such "chains" can be very long, so we limit how many we do.
    auto& options = getPassOptions();
    Index limit;
    if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
      limit = module->functions.size(); // no limit
    } else if (options.optimizeLevel >= 2) {
      // 10 passes usually does most of the work, as this is typically
      // logarithmic
      limit = 10;
    } else {
      limit = 1;
    }
    while (limit > 0) {
      limit--;
      // Hash all the functions
      auto hashes = FunctionHasher::createMap(module);
      FunctionHasher(&hashes).run(getPassRunner(), module);
      // Find hash-equal groups
      std::map<uint32_t, std::vector<Function*>> hashGroups;
      ModuleUtils::iterDefinedFunctions(*module, [&](Function* func) {
        hashGroups[hashes[func]].push_back(func);
      });
      // Find actually equal functions and prepare to replace them
      std::map<Name, Name> replacements;
      std::set<Name> duplicates;
      for (auto& [_, group] : hashGroups) {
        Index size = group.size();
        if (size == 1) {
          continue;
        }
        // The groups should be fairly small, and even if a group is large we
        // should have almost all of them identical, so we should not hit actual
        // O(N^2) here unless the hash is quite poor.
        for (Index i = 0; i < size - 1; i++) {
          auto* first = group[i];
          if (duplicates.count(first->name)) {
            continue;
          }
          for (Index j = i + 1; j < size; j++) {
            auto* second = group[j];
            if (duplicates.count(second->name)) {
              continue;
            }
            if (FunctionUtils::equal(first, second)) {
              // great, we can replace the second with the first!
              replacements[second->name] = first->name;
              duplicates.insert(second->name);
            }
          }
        }
      }
      // perform replacements
      if (replacements.size() > 0) {
        // remove the duplicates
        module->removeFunctions(
          [&](Function* func) { return duplicates.count(func->name) > 0; });
        OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      } else {
        break;
      }
    }
  }